

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O1

void __thiscall jbcoin::ValidatorKeys::ValidatorKeys(ValidatorKeys *this,KeyType *keyType)

{
  KeyType type;
  Seed SStack_78;
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> local_68;
  
  type = *keyType;
  this->keyType_ = type;
  (this->publicKey_).size_ = 0;
  this->tokenSequence_ = 0;
  this->revoked_ = false;
  randomSeed();
  generateKeyPair(&local_68,type,&SStack_78);
  PublicKey::operator=(&this->publicKey_,&local_68.first);
  *(undefined8 *)((this->secretKey_).buf_ + 0x10) = local_68.second.buf_._16_8_;
  *(undefined8 *)((this->secretKey_).buf_ + 0x18) = local_68.second.buf_._24_8_;
  *(undefined8 *)(this->secretKey_).buf_ = local_68.second.buf_._0_8_;
  *(undefined8 *)((this->secretKey_).buf_ + 8) = local_68.second.buf_._8_8_;
  SecretKey::~SecretKey(&local_68.second);
  Seed::~Seed(&SStack_78);
  return;
}

Assistant:

ValidatorKeys::ValidatorKeys (KeyType const& keyType)
    : keyType_ (keyType)
    , tokenSequence_ (0)
    , revoked_ (false)
{
    std::tie (publicKey_, secretKey_) = generateKeyPair (
        keyType_, randomSeed ());
}